

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O2

void __thiscall UIDisplayer::drawStartScreen(UIDisplayer *this)

{
  PrimitiveDisplayer *this_00;
  Colour *colour;
  string local_40;
  allocator local_19;
  
  glPushMatrix();
  glTranslatef((this->width + -580.0) * 0.5,(this->height + -200.0) * 0.5 + 7.5,0);
  this_00 = this->primitiveDisplayer;
  colour = Palette::getColour(this->palette,0);
  PrimitiveDisplayer::drawRectangleOutline(this_00,20.0,29.0,10.0,colour);
  glPopMatrix();
  std::__cxx11::string::string((string *)&local_40,"TETRIS",&local_19);
  drawParagraph(this,&local_40,this->height * 0.5 + 35.0,15.0,true);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"PRESS SPACE TO START",&local_19);
  drawParagraph(this,&local_40,this->height * 0.5 + 35.0 + 127.5,4.0);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void UIDisplayer::drawStartScreen(void) {
    GLfloat rectWidth = 29;
    GLfloat rectHeight = 10;

    glPushMatrix();
        glTranslatef((width - rectWidth * 20) / 2, 7.5 + (height - rectHeight * 20)/2, 0);
        primitiveDisplayer->drawRectangleOutline(20, rectWidth, rectHeight, palette->getColour(Palette::GREEN));
    glPopMatrix();
    
    drawParagraph("TETRIS", height/2 + 35, 15, true);
    drawParagraph("PRESS SPACE TO START", linebreak(height/2 + 35, 15), 4);
}